

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimacs_parser.cpp
# Opt level: O2

bool Satyricon::parse_file(SATSolver *solver,istream *is)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  long *plVar6;
  domain_error *pdVar7;
  uint uVar8;
  bool bVar9;
  uint number_of_variable;
  allocator local_261;
  int value;
  uint number_of_clausole;
  string p;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> c;
  string line;
  string cnf;
  string other;
  istringstream iss;
  uint auStack_190 [88];
  
  number_of_clausole = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00112426;
  } while (*line._M_dataplus._M_p == 'c');
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
  p._M_dataplus._M_p = (pointer)&p.field_2;
  p._M_string_length = 0;
  cnf._M_dataplus._M_p = (pointer)&cnf.field_2;
  cnf._M_string_length = 0;
  p.field_2._M_local_buf[0] = '\0';
  cnf.field_2._M_local_buf[0] = '\0';
  other._M_dataplus._M_p = (pointer)&other.field_2;
  other._M_string_length = 0;
  other.field_2._M_local_buf[0] = '\0';
  piVar5 = std::operator>>((istream *)&iss,(string *)&p);
  piVar5 = std::operator>>(piVar5,(string *)&cnf);
  piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
  piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    piVar5 = std::operator>>((istream *)&iss,(string *)&other);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      bVar2 = std::operator!=(&p,"p");
      if (!bVar2) {
        bVar2 = std::operator!=(&cnf,"cnf");
        if (!bVar2) {
          std::__cxx11::string::~string((string *)&other);
          std::__cxx11::string::~string((string *)&cnf);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
LAB_00112426:
          SATSolver::set_number_of_variable(solver,0);
          c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar8 = 0;
          do {
            do {
              piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 (is,(string *)&line);
              bVar9 = ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0;
              bVar2 = uVar8 < number_of_clausole;
              if (!bVar2 || !bVar9) goto LAB_00112555;
            } while ((line._M_string_length == 0) || (*line._M_dataplus._M_p == 'c'));
            std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
            do {
              while( true ) {
                uVar1 = *(uint *)((long)auStack_190 + *(long *)(_iss + -0x18));
                if ((uVar1 & 2) != 0) goto LAB_0011253f;
                plVar6 = (long *)std::istream::operator>>((istringstream *)&iss,&value);
                if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
                  pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&p,"invalid simbol on clausole ",&line);
                  std::domain_error::domain_error(pdVar7,(string *)&p);
                  __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
                }
                iVar4 = -value;
                if (0 < value) {
                  iVar4 = value;
                }
                if (iVar4 != 0) {
                  pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::string::string((string *)&cnf,"invalid variable ",&local_261);
                  std::__cxx11::to_string(&other,value);
                  std::operator+(&p,&cnf,&other);
                  std::domain_error::domain_error(pdVar7,(string *)&p);
                  __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
                }
                if (value == 0) break;
                p._M_dataplus._M_p._0_4_ = -2 - (value >> 0x1f);
                std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::
                emplace_back<Satyricon::Literal>(&c,(Literal *)&p);
              }
              bVar3 = SATSolver::add_clause(solver,&c);
              if (c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              uVar8 = uVar8 + 1;
            } while (!bVar3);
LAB_0011253f:
            std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
          } while ((uVar1 & 2) != 0);
LAB_00112555:
          std::_Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::~_Vector_base
                    (&c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)
          ;
          std::__cxx11::string::~string((string *)&line);
          return bVar2 && bVar9;
        }
      }
    }
  }
  pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error
            (pdVar7,"expected a \'p cnf NUMBER_OF_VARIABLE NUMBER_OF_CLAUSOLE\' as first line");
  __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

bool Satyricon::parse_file(SATSolver& solver, std::istream & is)
{
    unsigned int number_of_clausole = 0, number_of_variable = 0;
    std::string line;

    // find header line
    while (getline(is, line)) {
        if (line[0] == 'c') continue;

        std::istringstream iss(line);
        std::string p, cnf, other;

        if ( !(iss >> p >> cnf >> number_of_variable >> number_of_clausole)
                || (iss >> other) || p != "p" || cnf != "cnf")
            throw std::domain_error(
                    "expected a 'p cnf NUMBER_OF_VARIABLE NUMBER_OF_CLAUSOLE'"
                    " as first line");
        break;
    }
    solver.set_number_of_variable(number_of_variable);

    unsigned int read_clausole = 0;
    // read clausoles

    std::vector<Literal> c;
    int value;

    while (getline(is, line) && read_clausole < number_of_clausole ) {
        if ( line.size() == 0 || line[0] == 'c') continue;

        std::istringstream iss(line);

        while( !iss.eof() ) {
            if ( !(iss >> value) )
                throw std::domain_error("invalid simbol on clausole " + line);
            if(static_cast<unsigned int>(abs(value)) > number_of_variable)
                throw std::domain_error(std::string("invalid variable ")+std::to_string(value));

            if (value == 0) {
                read_clausole++;
                bool conflict = solver.add_clause(c);
                c.clear();
                if ( conflict ) return true; // found a conflict
            }
            else {
                c.push_back( Literal(abs(value)-1, value < 0) );
            }
        }
    }

    return false; // no conflict
}